

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_feat_resist_flag(parser *p)

{
  int iVar1;
  void *pvVar2;
  char *flag_name;
  wchar_t flag;
  feature *f;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  flag_name = parser_getsym(p,"flag");
  iVar1 = lookup_flag(mon_race_flags,flag_name);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (iVar1 == 0) {
    p_local._4_4_ = PARSE_ERROR_INVALID_FLAG;
  }
  else {
    *(int *)((long)pvVar2 + 0x70) = iVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_feat_resist_flag(struct parser *p) {
	struct feature *f = parser_priv(p);
	int flag = lookup_flag(mon_race_flags, parser_getsym(p, "flag"));

	if (!f) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (flag == FLAG_END) {
		return PARSE_ERROR_INVALID_FLAG;
	}
	f->resist_flag = flag;
	return PARSE_ERROR_NONE;
}